

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void run_proper_context_tests(int use_prealloc)

{
  uint uVar1;
  _func_void_char_ptr_void_ptr *p_Var2;
  int iVar3;
  secp256k1_context *psVar4;
  secp256k1_context *psVar5;
  secp256k1_context *psVar6;
  secp256k1_context *psVar7;
  secp256k1_context *psVar8;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  long lVar9;
  code *unaff_RBX;
  secp256k1_scalar *num;
  secp256k1_context *psVar10;
  secp256k1_context *unaff_R12;
  secp256k1_context *unaff_R13;
  int32_t dummy;
  secp256k1_ge pub;
  uchar seed [32];
  secp256k1_scalar sigs;
  secp256k1_scalar sigr;
  secp256k1_scalar msg;
  secp256k1_scalar nonce;
  secp256k1_scalar key;
  secp256k1_gej pubj;
  int iStackY_244;
  undefined4 uStackY_240;
  undefined4 uStackY_23c;
  undefined4 uStackY_238;
  undefined4 uStackY_234;
  undefined8 uStackY_230;
  undefined8 uStackY_228;
  undefined8 uStackY_220;
  undefined8 uStackY_218;
  secp256k1_context *psStackY_210;
  secp256k1_context *psStackY_208;
  secp256k1_context *psStackY_200;
  undefined4 local_1e8;
  int local_1e4;
  secp256k1_context *local_1e0;
  secp256k1_context *local_1d8;
  secp256k1_ge local_1d0;
  uchar local_178 [32];
  undefined1 local_158 [64];
  undefined1 local_118 [96];
  secp256k1_gej local_b8;
  
  num = (secp256k1_scalar *)(ulong)(uint)use_prealloc;
  local_1e8 = 0;
  local_178[0x10] = '\0';
  local_178[0x11] = '\0';
  local_178[0x12] = '\0';
  local_178[0x13] = '\0';
  local_178[0x14] = '\0';
  local_178[0x15] = '\0';
  local_178[0x16] = '\0';
  local_178[0x17] = '\0';
  local_178[0x18] = '\0';
  local_178[0x19] = '\0';
  local_178[0x1a] = '\0';
  local_178[0x1b] = '\0';
  local_178[0x1c] = '\0';
  local_178[0x1d] = '\0';
  local_178[0x1e] = '\0';
  local_178[0x1f] = '\0';
  local_178[0] = '\x17';
  local_178[1] = '\0';
  local_178[2] = '\0';
  local_178[3] = '\0';
  local_178[4] = '\0';
  local_178[5] = '\0';
  local_178[6] = '\0';
  local_178[7] = '\0';
  local_178[8] = '\0';
  local_178[9] = '\0';
  local_178[10] = '\0';
  local_178[0xb] = '\0';
  local_178[0xc] = '\0';
  local_178[0xd] = '\0';
  local_178[0xe] = '\0';
  local_178[0xf] = '\0';
  psStackY_200 = (secp256k1_context *)0x138be5;
  psVar4 = secp256k1_context_create(1);
  if (use_prealloc == 0) {
    psStackY_200 = (secp256k1_context *)0x138c62;
    psVar6 = secp256k1_context_create(1);
    psVar5 = (secp256k1_context *)0x0;
  }
  else {
    local_b8.x.n[0] = 0x4d430002;
    local_b8.x.n[1] = 0;
    local_b8.x.n[2] = 0;
    local_b8.x.n[3] = 0;
    local_b8.x.n[4] = 0;
    local_b8.y.n[0] = 0;
    local_1d0.x.n[0] = 0;
    psStackY_200 = (secp256k1_context *)0x138c3a;
    psVar5 = (secp256k1_context *)malloc(0xd0);
    if (psVar5 == (secp256k1_context *)0x0) goto LAB_0013917b;
    psStackY_200 = (secp256k1_context *)0x138c53;
    psVar6 = secp256k1_context_preallocated_create(psVar5,1);
  }
  psStackY_200 = (secp256k1_context *)0x138c73;
  iVar3 = context_eq(psVar6,psVar4);
  if (iVar3 == 0) {
    psStackY_200 = (secp256k1_context *)0x1390eb;
    run_proper_context_tests_cold_27();
LAB_001390eb:
    psStackY_200 = (secp256k1_context *)0x1390f3;
    run_proper_context_tests_cold_26();
LAB_001390f3:
    psStackY_200 = (secp256k1_context *)0x1390f8;
    run_proper_context_tests_cold_2();
LAB_001390f8:
    psStackY_200 = (secp256k1_context *)0x139100;
    run_proper_context_tests_cold_25();
LAB_00139100:
    psStackY_200 = (secp256k1_context *)0x139105;
    run_proper_context_tests_cold_24();
  }
  else {
    if ((psVar6->ecmult_gen_ctx).built == 0) goto LAB_001390eb;
    psStackY_200 = (secp256k1_context *)0x138c95;
    secp256k1_ecmult_gen_blind(&psVar6->ecmult_gen_ctx,local_178);
    psStackY_200 = (secp256k1_context *)0x138ca0;
    iVar3 = context_eq(psVar6,psVar4);
    if (iVar3 != 0) goto LAB_001390f3;
    if ((psVar6->ecmult_gen_ctx).built == 0) goto LAB_001390f8;
    psStackY_200 = (secp256k1_context *)0x138cbc;
    secp256k1_ecmult_gen_blind(&psVar6->ecmult_gen_ctx,(uchar *)0x0);
    psStackY_200 = (secp256k1_context *)0x138cc7;
    iVar3 = context_eq(psVar6,psVar4);
    if (iVar3 == 0) goto LAB_00139100;
    if (secp256k1_context_static != psVar6) {
      (psVar6->error_callback).fn = secp256k1_default_illegal_callback_fn;
      (psVar6->error_callback).data = (void *)0x0;
      goto LAB_00138cf5;
    }
  }
  psStackY_200 = (secp256k1_context *)0x13910d;
  run_proper_context_tests_cold_3();
LAB_00138cf5:
  uVar1 = (psVar6->ecmult_gen_ctx).built;
  unaff_RBX = (code *)(ulong)uVar1;
  if (uVar1 == 0) {
    psStackY_200 = (secp256k1_context *)0x13911a;
    run_proper_context_tests_cold_4();
  }
  local_b8.x.n[0] = 0x4d430002;
  local_b8.x.n[1] = 0;
  local_b8.x.n[2] = 0;
  local_b8.x.n[3] = 0;
  local_b8.x.n[4] = 0;
  local_b8.y.n[0] = 0;
  local_1d0.x.n[0] = 0;
  if (uVar1 == 0) {
    psStackY_200 = (secp256k1_context *)0x139124;
    run_proper_context_tests_cold_23();
    goto LAB_00139124;
  }
  if (use_prealloc == 0) {
    local_b8.x.n[0] = 0x4d430002;
    local_b8.x.n[1] = 0;
    local_b8.x.n[2] = 0;
    local_b8.x.n[3] = 0;
    local_b8.x.n[4] = 0;
    local_b8.y.n[0] = 0;
    local_1d0.x.n[0] = 0;
    psStackY_200 = (secp256k1_context *)0x138e68;
    psVar8 = (secp256k1_context *)malloc(0xd0);
    if (psVar8 == (secp256k1_context *)0x0) goto LAB_0013919f;
    if ((psVar6->ecmult_gen_ctx).built == 0) goto LAB_001391a4;
    psStackY_200 = (secp256k1_context *)0x138e91;
    memcpy(psVar8,psVar6,0xd0);
    psVar7 = psVar8;
    goto LAB_00138e94;
  }
  psStackY_200 = (secp256k1_context *)0x138d5c;
  unaff_R12 = secp256k1_context_clone(psVar6);
  psStackY_200 = (secp256k1_context *)0x138d6a;
  iVar3 = context_eq(psVar6,unaff_R12);
  unaff_R13 = psVar5;
  if (iVar3 == 0) goto LAB_00139180;
  psStackY_200 = (secp256k1_context *)0x138d7a;
  secp256k1_context_preallocated_destroy(psVar6);
  psStackY_200 = (secp256k1_context *)0x138d82;
  free(psVar5);
  local_b8.x.n[0] = 0x4d430002;
  local_b8.x.n[1] = 0;
  local_b8.x.n[2] = 0;
  local_b8.x.n[3] = 0;
  local_b8.x.n[4] = 0;
  local_b8.y.n[0] = 0;
  local_1d0.x.n[0] = 0;
  psStackY_200 = (secp256k1_context *)0x138dd0;
  psVar7 = (secp256k1_context *)malloc(0xd0);
  if (psVar7 == (secp256k1_context *)0x0) goto LAB_00139185;
  if ((unaff_R12->ecmult_gen_ctx).built == 0) goto LAB_0013918a;
  psStackY_200 = (secp256k1_context *)0x138df7;
  memcpy(psVar7,unaff_R12,0xd0);
  psVar6 = psVar7;
  while( true ) {
    psStackY_200 = (secp256k1_context *)0x138e05;
    iVar3 = context_eq(unaff_R12,psVar6);
    if (iVar3 == 0) break;
    psStackY_200 = (secp256k1_context *)0x138e15;
    secp256k1_context_destroy(unaff_R12);
    psVar8 = unaff_R12;
    psVar5 = psVar7;
LAB_00138ee0:
    p_Var2 = (psVar6->error_callback).fn;
    unaff_R12 = psVar8;
    if (p_Var2 == secp256k1_default_error_callback_fn) {
LAB_00139124:
      psStackY_200 = (secp256k1_context *)0x139129;
      run_proper_context_tests_cold_19();
LAB_00139129:
      psStackY_200 = (secp256k1_context *)0x13912e;
      run_proper_context_tests_cold_10();
LAB_0013912e:
      psStackY_200 = (secp256k1_context *)0x13913d;
      run_proper_context_tests_cold_11();
    }
    else {
      unaff_RBX = secp256k1_default_illegal_callback_fn;
      if (p_Var2 != secp256k1_default_illegal_callback_fn) goto LAB_00139129;
      if (secp256k1_context_static == psVar6) goto LAB_0013912e;
      (psVar6->error_callback).fn = secp256k1_default_error_callback_fn;
      (psVar6->error_callback).data = (void *)0x0;
    }
    psStackY_200 = (secp256k1_context *)0x138f31;
    iVar3 = context_eq(psVar6,psVar4);
    if (iVar3 == 0) {
      psStackY_200 = (secp256k1_context *)0x139147;
      run_proper_context_tests_cold_18();
      unaff_R13 = psVar5;
LAB_00139147:
      psStackY_200 = (secp256k1_context *)0x139152;
      run_proper_context_tests_cold_12();
    }
    else {
      unaff_R13 = (secp256k1_context *)&psVar6->illegal_callback;
      unaff_R12 = (secp256k1_context *)&(psVar6->illegal_callback).data;
      local_1d8 = psVar5;
      if (secp256k1_context_static == psVar6) goto LAB_00139147;
      ((secp256k1_callback *)unaff_R13)->fn = counting_callback_fn;
      *(undefined4 **)unaff_R12 = &local_1e8;
    }
    if ((undefined4 *)(psVar6->illegal_callback).data == &local_1e8) {
      if (secp256k1_context_static == psVar6) goto LAB_0013915c;
      *(code **)&unaff_R13->ecmult_gen_ctx = unaff_RBX;
      *(uint64_t *)&unaff_R12->ecmult_gen_ctx = 0;
    }
    else {
      psStackY_200 = (secp256k1_context *)0x13915c;
      run_proper_context_tests_cold_13();
LAB_0013915c:
      psStackY_200 = (secp256k1_context *)0x139167;
      run_proper_context_tests_cold_14();
    }
    psStackY_200 = (secp256k1_context *)0x138fa6;
    iVar3 = context_eq(psVar6,psVar4);
    if (iVar3 == 0) {
      psStackY_200 = (secp256k1_context *)0x139171;
      run_proper_context_tests_cold_17();
LAB_00139171:
      psStackY_200 = (secp256k1_context *)0x139176;
      run_proper_context_tests_cold_16();
    }
    else {
      local_1e4 = (int)num;
      unaff_R12 = (secp256k1_context *)local_118;
      psStackY_200 = (secp256k1_context *)0x138fc7;
      local_1e0 = psVar4;
      testutil_random_scalar_order_test((secp256k1_scalar *)unaff_R12);
      unaff_R13 = (secp256k1_context *)(local_118 + 0x40);
      psStackY_200 = (secp256k1_context *)0x138fd7;
      testutil_random_scalar_order_test((secp256k1_scalar *)unaff_R13);
      psStackY_200 = (secp256k1_context *)0x138fed;
      secp256k1_ecmult_gen(&psVar6->ecmult_gen_ctx,&local_b8,(secp256k1_scalar *)unaff_R13);
      psStackY_200 = (secp256k1_context *)0x138ffa;
      secp256k1_ge_set_gej(&local_1d0,&local_b8);
      num = (secp256k1_scalar *)(local_118 + 0x20);
      psVar4 = (secp256k1_context *)(local_158 + 0x20);
      unaff_RBX = (code *)local_158;
      do {
        psStackY_200 = (secp256k1_context *)0x13901a;
        testutil_random_scalar_order_test(num);
        psStackY_200 = (secp256k1_context *)0x139039;
        iVar3 = secp256k1_ecdsa_sig_sign
                          (&psVar6->ecmult_gen_ctx,(secp256k1_scalar *)psVar4,
                           (secp256k1_scalar *)unaff_RBX,(secp256k1_scalar *)unaff_R13,
                           (secp256k1_scalar *)unaff_R12,num,(int *)0x0);
      } while (iVar3 == 0);
      psStackY_200 = (secp256k1_context *)0x139075;
      iVar3 = secp256k1_ecdsa_sig_sign
                        (&psVar6->ecmult_gen_ctx,(secp256k1_scalar *)(local_158 + 0x20),
                         (secp256k1_scalar *)local_158,(secp256k1_scalar *)(local_118 + 0x40),
                         (secp256k1_scalar *)local_118,(secp256k1_scalar *)(local_118 + 0x20),
                         (int *)0x0);
      if (iVar3 == 0) goto LAB_00139171;
      psStackY_200 = (secp256k1_context *)0x13909f;
      iVar3 = secp256k1_ecdsa_sig_verify
                        ((secp256k1_scalar *)(local_158 + 0x20),(secp256k1_scalar *)local_158,
                         &local_1d0,(secp256k1_scalar *)local_118);
      if (iVar3 != 0) {
        if (local_1e4 == 0) {
          psStackY_200 = (secp256k1_context *)0x1390ca;
          secp256k1_context_destroy(psVar6);
        }
        else {
          psStackY_200 = (secp256k1_context *)0x1390b6;
          secp256k1_context_preallocated_destroy(psVar6);
          psStackY_200 = (secp256k1_context *)0x1390c0;
          free(local_1d8);
        }
        psStackY_200 = (secp256k1_context *)0x1390d4;
        secp256k1_context_destroy(local_1e0);
        return;
      }
    }
    psStackY_200 = (secp256k1_context *)0x13917b;
    run_proper_context_tests_cold_15();
LAB_0013917b:
    psStackY_200 = (secp256k1_context *)0x139180;
    run_proper_context_tests_cold_1();
LAB_00139180:
    psStackY_200 = (secp256k1_context *)0x139185;
    run_proper_context_tests_cold_8();
    psVar5 = unaff_R13;
LAB_00139185:
    psVar7 = psVar5;
    psStackY_200 = (secp256k1_context *)0x13918a;
    run_proper_context_tests_cold_7();
LAB_0013918a:
    psStackY_200 = (secp256k1_context *)0x139192;
    run_proper_context_tests_cold_5();
    psVar6 = (secp256k1_context *)0x0;
  }
  psStackY_200 = (secp256k1_context *)0x13919f;
  run_proper_context_tests_cold_6();
LAB_0013919f:
  psVar8 = unaff_R12;
  psVar5 = (secp256k1_context *)unaff_RBX;
  psStackY_200 = (secp256k1_context *)0x1391a4;
  run_proper_context_tests_cold_22();
LAB_001391a4:
  psStackY_200 = (secp256k1_context *)0x1391ac;
  run_proper_context_tests_cold_9();
  psVar7 = (secp256k1_context *)0x0;
LAB_00138e94:
  psStackY_200 = (secp256k1_context *)0x138e9f;
  psVar10 = psVar6;
  iVar3 = context_eq(psVar6,psVar7);
  if (iVar3 == 0) {
    psStackY_200 = (secp256k1_context *)0x1391b9;
    run_proper_context_tests_cold_21();
  }
  else {
    psStackY_200 = (secp256k1_context *)0x138eaf;
    secp256k1_context_destroy(psVar6);
    psStackY_200 = (secp256k1_context *)0x138eb7;
    psVar6 = secp256k1_context_clone(psVar7);
    psStackY_200 = (secp256k1_context *)0x138ec5;
    psVar10 = psVar7;
    iVar3 = context_eq(psVar7,psVar6);
    if (iVar3 != 0) {
      psStackY_200 = (secp256k1_context *)0x138ed5;
      secp256k1_context_preallocated_destroy(psVar7);
      psStackY_200 = (secp256k1_context *)0x138edd;
      free(psVar8);
      unaff_RBX = (code *)psVar5;
      goto LAB_00138ee0;
    }
  }
  psStackY_200 = (secp256k1_context *)run_static_context_tests;
  run_proper_context_tests_cold_20();
  psVar8 = STATIC_CTX;
  psStackY_210 = psVar5;
  psStackY_208 = psVar4;
  psStackY_200 = psVar6;
  if (secp256k1_context_no_precomp != secp256k1_context_static) goto LAB_0013923d;
  psVar5 = (secp256k1_context *)((ulong)psVar10 & 0xffffffff);
  uStackY_220 = 0;
  uStackY_218 = 0;
  uStackY_230 = 0x17;
  uStackY_228 = 0;
  iStackY_244 = 0;
  uStackY_240 = *(undefined4 *)&(STATIC_CTX->illegal_callback).fn;
  uStackY_23c = *(undefined4 *)((long)&(STATIC_CTX->illegal_callback).fn + 4);
  uStackY_238 = *(undefined4 *)&(STATIC_CTX->illegal_callback).data;
  uStackY_234 = *(undefined4 *)((long)&(STATIC_CTX->illegal_callback).data + 4);
  psVar4 = STATIC_CTX;
  if (secp256k1_context_no_precomp == STATIC_CTX) goto LAB_00139242;
  (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
  (psVar8->illegal_callback).data = &iStackY_244;
  while ((psVar8->ecmult_gen_ctx).built != 0) {
    run_static_context_tests_cold_2();
LAB_0013923d:
    run_static_context_tests_cold_1();
    psVar4 = extraout_RAX;
LAB_00139242:
    (*(psVar4->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar4->illegal_callback).data);
    psVar8 = STATIC_CTX;
  }
  (*(psVar8->illegal_callback).fn)
            ("secp256k1_context_is_proper(ctx)",(psVar8->illegal_callback).data);
  psVar4 = STATIC_CTX;
  (STATIC_CTX->illegal_callback).fn =
       (_func_void_char_ptr_void_ptr *)CONCAT44(uStackY_23c,uStackY_240);
  (psVar4->illegal_callback).data = (void *)CONCAT44(uStackY_234,uStackY_238);
  if (iStackY_244 != 1) goto LAB_001392d4;
  iStackY_244 = 0;
  uStackY_240 = *(undefined4 *)&(psVar4->illegal_callback).fn;
  uStackY_23c = *(undefined4 *)((long)&(psVar4->illegal_callback).fn + 4);
  uStackY_238 = *(undefined4 *)&(psVar4->illegal_callback).data;
  uStackY_234 = *(undefined4 *)((long)&(psVar4->illegal_callback).data + 4);
  if (secp256k1_context_static == psVar4) goto LAB_001392d9;
  (psVar4->illegal_callback).fn = counting_callback_fn;
  (psVar4->illegal_callback).data = &iStackY_244;
  while ((psVar4->ecmult_gen_ctx).built != 0) {
    run_static_context_tests_cold_4();
LAB_001392d4:
    run_static_context_tests_cold_3();
    psVar4 = extraout_RAX_00;
LAB_001392d9:
    (*(psVar4->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar4->illegal_callback).data);
    psVar4 = STATIC_CTX;
  }
  (*(psVar4->illegal_callback).fn)
            ("secp256k1_context_is_proper(ctx)",(psVar4->illegal_callback).data);
  psVar4 = STATIC_CTX;
  (STATIC_CTX->illegal_callback).fn =
       (_func_void_char_ptr_void_ptr *)CONCAT44(uStackY_23c,uStackY_240);
  (psVar4->illegal_callback).data = (void *)CONCAT44(uStackY_234,uStackY_238);
  if (iStackY_244 != 1) goto LAB_00139487;
  if ((int)psVar5 != 0) {
    iStackY_244 = 0;
    uStackY_240 = *(undefined4 *)&(psVar4->illegal_callback).fn;
    uStackY_23c = *(undefined4 *)((long)&(psVar4->illegal_callback).fn + 4);
    uStackY_238 = *(undefined4 *)&(psVar4->illegal_callback).data;
    uStackY_234 = *(undefined4 *)((long)&(psVar4->illegal_callback).data + 4);
    if (secp256k1_context_static == psVar4) goto LAB_001394b1;
    (psVar4->illegal_callback).fn = counting_callback_fn;
    (psVar4->illegal_callback).data = &iStackY_244;
    goto LAB_0013947d;
  }
  iStackY_244 = 0;
  uStackY_240 = *(undefined4 *)&(psVar4->illegal_callback).fn;
  uStackY_23c = *(undefined4 *)((long)&(psVar4->illegal_callback).fn + 4);
  uStackY_238 = *(undefined4 *)&(psVar4->illegal_callback).data;
  uStackY_234 = *(undefined4 *)((long)&(psVar4->illegal_callback).data + 4);
  if (secp256k1_context_static == psVar4) goto LAB_0013948c;
  (psVar4->illegal_callback).fn = counting_callback_fn;
  (psVar4->illegal_callback).data = &iStackY_244;
  do {
    psVar6 = secp256k1_context_clone(psVar4);
    psVar4 = STATIC_CTX;
    if (psVar6 == (secp256k1_context *)0x0) {
      (STATIC_CTX->illegal_callback).fn =
           (_func_void_char_ptr_void_ptr *)CONCAT44(uStackY_23c,uStackY_240);
      (psVar4->illegal_callback).data = (void *)CONCAT44(uStackY_234,uStackY_238);
      if (iStackY_244 == 1) {
        iStackY_244 = 0;
        uStackY_240 = *(undefined4 *)&(psVar4->illegal_callback).fn;
        uStackY_23c = *(undefined4 *)((long)&(psVar4->illegal_callback).fn + 4);
        uStackY_238 = *(undefined4 *)&(psVar4->illegal_callback).data;
        uStackY_234 = *(undefined4 *)((long)&(psVar4->illegal_callback).data + 4);
        if (secp256k1_context_static == psVar4) goto LAB_00139574;
        (psVar4->illegal_callback).fn = counting_callback_fn;
        (psVar4->illegal_callback).data = &iStackY_244;
      }
      else {
LAB_0013956f:
        run_static_context_tests_cold_14();
        psVar4 = extraout_RAX_03;
LAB_00139574:
        (*(psVar4->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar4->illegal_callback).data);
        psVar4 = STATIC_CTX;
      }
      secp256k1_context_destroy(psVar4);
      psVar5 = STATIC_CTX;
      (STATIC_CTX->illegal_callback).fn =
           (_func_void_char_ptr_void_ptr *)CONCAT44(uStackY_23c,uStackY_240);
      (psVar5->illegal_callback).data = (void *)CONCAT44(uStackY_234,uStackY_238);
      if (iStackY_244 == 1) goto LAB_00139401;
      run_static_context_tests_cold_15();
LAB_00139599:
      run_static_context_tests_cold_16();
LAB_00139436:
      run_static_context_tests_cold_17();
      return;
    }
    run_static_context_tests_cold_13();
    psVar4 = extraout_RAX_02;
LAB_001394b1:
    (*(psVar4->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar4->illegal_callback).data);
    psVar4 = STATIC_CTX;
LAB_0013947d:
    if ((psVar4->ecmult_gen_ctx).built == 0) {
      (*(psVar4->illegal_callback).fn)
                ("secp256k1_context_is_proper(ctx)",(psVar4->illegal_callback).data);
      psVar4 = STATIC_CTX;
      (STATIC_CTX->illegal_callback).fn =
           (_func_void_char_ptr_void_ptr *)CONCAT44(uStackY_23c,uStackY_240);
      (psVar4->illegal_callback).data = (void *)CONCAT44(uStackY_234,uStackY_238);
      if (iStackY_244 == 1) {
        psVar6 = (secp256k1_context *)malloc(0xd0);
        if (psVar6 == (secp256k1_context *)0x0) goto LAB_001395b6;
        memset(psVar6,0x2a,0xd0);
        iStackY_244 = 0;
        uStackY_240 = *(undefined4 *)&(psVar4->illegal_callback).fn;
        uStackY_23c = *(undefined4 *)((long)&(psVar4->illegal_callback).fn + 4);
        uStackY_238 = *(undefined4 *)&(psVar4->illegal_callback).data;
        uStackY_234 = *(undefined4 *)((long)&(psVar4->illegal_callback).data + 4);
        psVar5 = psVar6;
        if (secp256k1_context_static == psVar4) goto LAB_001395bb;
        (psVar4->illegal_callback).fn = counting_callback_fn;
        (psVar4->illegal_callback).data = &iStackY_244;
      }
      else {
        run_static_context_tests_cold_7();
LAB_001395b6:
        run_static_context_tests_cold_12();
LAB_001395bb:
        (*(psVar4->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar4->illegal_callback).data);
        psVar4 = STATIC_CTX;
      }
      if ((psVar4->ecmult_gen_ctx).built != 0) {
        run_static_context_tests_cold_8();
        goto LAB_0013956f;
      }
      (*(psVar4->illegal_callback).fn)
                ("secp256k1_context_is_proper(ctx)",(psVar4->illegal_callback).data);
      psVar4 = STATIC_CTX;
      (STATIC_CTX->illegal_callback).fn =
           (_func_void_char_ptr_void_ptr *)CONCAT44(uStackY_23c,uStackY_240);
      (psVar4->illegal_callback).data = (void *)CONCAT44(uStackY_234,uStackY_238);
      if (iStackY_244 != 1) goto LAB_0013968e;
      lVar9 = 0;
      do {
        if (*(char *)((long)(psVar5->ecmult_gen_ctx).scalar_offset.d + lVar9 + -8) != '*')
        goto LAB_00139693;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0xd0);
      free(psVar5);
      iStackY_244 = 0;
      uStackY_240 = *(undefined4 *)&(psVar4->illegal_callback).fn;
      uStackY_23c = *(undefined4 *)((long)&(psVar4->illegal_callback).fn + 4);
      uStackY_238 = *(undefined4 *)&(psVar4->illegal_callback).data;
      uStackY_234 = *(undefined4 *)((long)&(psVar4->illegal_callback).data + 4);
      if (secp256k1_context_static == psVar4) goto LAB_00139698;
      (psVar4->illegal_callback).fn = counting_callback_fn;
      (psVar4->illegal_callback).data = &iStackY_244;
      while( true ) {
        secp256k1_context_preallocated_destroy(psVar4);
        psVar5 = STATIC_CTX;
        (STATIC_CTX->illegal_callback).fn =
             (_func_void_char_ptr_void_ptr *)CONCAT44(uStackY_23c,uStackY_240);
        (psVar5->illegal_callback).data = (void *)CONCAT44(uStackY_234,uStackY_238);
        if (iStackY_244 == 1) break;
        run_static_context_tests_cold_11();
LAB_0013968e:
        run_static_context_tests_cold_9();
LAB_00139693:
        run_static_context_tests_cold_10();
LAB_00139698:
        (*(psVar4->illegal_callback).fn)
                  ("ctx != secp256k1_context_static",(psVar4->illegal_callback).data);
        psVar4 = STATIC_CTX;
      }
LAB_00139401:
      uStackY_240 = 0;
      if (secp256k1_context_static != psVar5) {
        (psVar5->illegal_callback).fn = counting_callback_fn;
        (psVar5->illegal_callback).data = &uStackY_240;
        goto LAB_00139436;
      }
      goto LAB_00139599;
    }
    run_static_context_tests_cold_6();
LAB_00139487:
    run_static_context_tests_cold_5();
    psVar4 = extraout_RAX_01;
LAB_0013948c:
    (*(psVar4->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar4->illegal_callback).data);
    psVar4 = STATIC_CTX;
  } while( true );
}

Assistant:

static void run_proper_context_tests(int use_prealloc) {
    int32_t dummy = 0;
    secp256k1_context *my_ctx, *my_ctx_fresh;
    void *my_ctx_prealloc = NULL;
    unsigned char seed[32] = {0x17};

    secp256k1_gej pubj;
    secp256k1_ge pub;
    secp256k1_scalar msg, key, nonce;
    secp256k1_scalar sigr, sigs;

    /* Fresh reference context for comparison */
    my_ctx_fresh = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (use_prealloc) {
        my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
        CHECK(my_ctx_prealloc != NULL);
        my_ctx = secp256k1_context_preallocated_create(my_ctx_prealloc, SECP256K1_CONTEXT_NONE);
    } else {
        my_ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);
    }

    /* Randomize and reset randomization */
    CHECK(context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, seed) == 1);
    CHECK(!context_eq(my_ctx, my_ctx_fresh));
    CHECK(secp256k1_context_randomize(my_ctx, NULL) == 1);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* set error callback (to a function that still aborts in case malloc() fails in secp256k1_context_clone() below) */
    secp256k1_context_set_error_callback(my_ctx, secp256k1_default_illegal_callback_fn, NULL);
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);

    /* check if sizes for cloning are consistent */
    CHECK(secp256k1_context_preallocated_clone_size(my_ctx) == secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));

    /*** clone and destroy all of them to make sure cloning was complete ***/
    {
        secp256k1_context *ctx_tmp;

        if (use_prealloc) {
            /* clone into a non-preallocated context and then again into a new preallocated one. */
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);

            free(my_ctx_prealloc);
            my_ctx_prealloc = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(my_ctx_prealloc != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, my_ctx_prealloc);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);
        } else {
            /* clone into a preallocated context and then again into a new non-preallocated one. */
            void *prealloc_tmp;

            prealloc_tmp = malloc(secp256k1_context_preallocated_size(SECP256K1_CONTEXT_NONE));
            CHECK(prealloc_tmp != NULL);
            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_preallocated_clone(my_ctx, prealloc_tmp);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_destroy(ctx_tmp);

            ctx_tmp = my_ctx;
            my_ctx = secp256k1_context_clone(my_ctx);
            CHECK(context_eq(ctx_tmp, my_ctx));
            secp256k1_context_preallocated_destroy(ctx_tmp);
            free(prealloc_tmp);
        }
    }

    /* Verify that the error callback makes it across the clone. */
    CHECK(my_ctx->error_callback.fn != secp256k1_default_error_callback_fn);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_illegal_callback_fn);
    /* And that it resets back to default. */
    secp256k1_context_set_error_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->error_callback.fn == secp256k1_default_error_callback_fn);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /* Verify that setting and resetting illegal callback works */
    secp256k1_context_set_illegal_callback(my_ctx, counting_callback_fn, &dummy);
    CHECK(my_ctx->illegal_callback.fn == counting_callback_fn);
    CHECK(my_ctx->illegal_callback.data == &dummy);
    secp256k1_context_set_illegal_callback(my_ctx, NULL, NULL);
    CHECK(my_ctx->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
    CHECK(my_ctx->illegal_callback.data == NULL);
    CHECK(context_eq(my_ctx, my_ctx_fresh));

    /*** attempt to use them ***/
    testutil_random_scalar_order_test(&msg);
    testutil_random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&my_ctx->ecmult_gen_ctx, &pubj, &key);
    secp256k1_ge_set_gej(&pub, &pubj);

    /* obtain a working nonce */
    do {
        testutil_random_scalar_order_test(&nonce);
    } while(!secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try signing */
    CHECK(secp256k1_ecdsa_sig_sign(&my_ctx->ecmult_gen_ctx, &sigr, &sigs, &key, &msg, &nonce, NULL));

    /* try verifying */
    CHECK(secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));

    /* cleanup */
    if (use_prealloc) {
        secp256k1_context_preallocated_destroy(my_ctx);
        free(my_ctx_prealloc);
    } else {
        secp256k1_context_destroy(my_ctx);
    }
    secp256k1_context_destroy(my_ctx_fresh);

    /* Defined as no-op. */
    secp256k1_context_destroy(NULL);
    secp256k1_context_preallocated_destroy(NULL);
}